

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result utf8_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  bool bVar1;
  char **ppcVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  ptrdiff_t bytesToCopy;
  char *fromLimBefore;
  ptrdiff_t bytesStorable;
  ptrdiff_t bytesAvailable;
  _Bool output_exhausted;
  _Bool input_incomplete;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  lVar3 = (long)toLim - (long)*toP;
  bVar1 = lVar3 < (long)fromLim - (long)*fromP;
  toP_local = (char **)fromLim;
  if (bVar1) {
    toP_local = (char **)(*fromP + lVar3);
  }
  ppcVar2 = toP_local;
  fromLim_local = (char *)fromP;
  fromP_local = (char **)enc;
  _INTERNAL_trim_to_complete_utf8_characters(*fromP,(char **)&toP_local);
  bVar4 = toP_local < ppcVar2;
  __n = (long)toP_local - *(long *)fromLim_local;
  memcpy(*toP,*(void **)fromLim_local,__n);
  *(size_t *)fromLim_local = __n + *(long *)fromLim_local;
  *toP = *toP + __n;
  if (bVar1) {
    enc_local._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
  else if (bVar4) {
    enc_local._4_4_ = XML_CONVERT_INPUT_INCOMPLETE;
  }
  else {
    enc_local._4_4_ = XML_CONVERT_COMPLETED;
  }
  return enc_local._4_4_;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf8(const ENCODING *enc, const char **fromP, const char *fromLim,
            char **toP, const char *toLim) {
  bool input_incomplete = false;
  bool output_exhausted = false;

  /* Avoid copying partial characters (due to limited space). */
  const ptrdiff_t bytesAvailable = fromLim - *fromP;
  const ptrdiff_t bytesStorable = toLim - *toP;
  UNUSED_P(enc);
  if (bytesAvailable > bytesStorable) {
    fromLim = *fromP + bytesStorable;
    output_exhausted = true;
  }

  /* Avoid copying partial characters (from incomplete input). */
  {
    const char *const fromLimBefore = fromLim;
    _INTERNAL_trim_to_complete_utf8_characters(*fromP, &fromLim);
    if (fromLim < fromLimBefore) {
      input_incomplete = true;
    }
  }

  {
    const ptrdiff_t bytesToCopy = fromLim - *fromP;
    memcpy(*toP, *fromP, bytesToCopy);
    *fromP += bytesToCopy;
    *toP += bytesToCopy;
  }

  if (output_exhausted) /* needs to go first */
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else if (input_incomplete)
    return XML_CONVERT_INPUT_INCOMPLETE;
  else
    return XML_CONVERT_COMPLETED;
}